

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PerformImplementation.hpp
# Opt level: O3

void InstructionSet::M68k::Primitive::
     apply_sr_ccr<(InstructionSet::M68k::Operation)35,CPU::MC68000::ProcessorBase>
               (uint16_t source,Status *status,ProcessorBase *flow_controller)

{
  bool bVar1;
  ushort uVar2;
  uint16_t uVar3;
  uint uVar4;
  
  uVar3 = Status::status(status);
  uVar2 = uVar3 & source;
  uVar4 = (uint)uVar2;
  status->carry_flag = (ulong)(uVar4 & 1);
  status->overflow_flag = (ulong)(uVar4 & 2);
  status->zero_result = (ulong)(~uVar4 & 4);
  status->negative_flag = (ulong)(uVar4 & 8);
  status->extend_flag = (ulong)(uVar4 & 0x10);
  status->interrupt_level = uVar2 >> 8 & 7;
  status->trace_flag = (ulong)(uVar4 & 0x8000);
  status->is_supervisor = (bool)((byte)(uVar2 >> 0xd) & 1);
  flow_controller->stack_pointers_[flow_controller->is_supervisor_] =
       flow_controller->registers_[0xf];
  bVar1 = (flow_controller->status_).is_supervisor;
  flow_controller->registers_[0xf] = flow_controller->stack_pointers_[bVar1];
  flow_controller->is_supervisor_ = (uint)bVar1;
  return;
}

Assistant:

void apply_sr_ccr(uint16_t source, Status &status, FlowController &flow_controller) {
	static_assert(
		operation == Operation::ANDItoSR ||	operation == Operation::ANDItoCCR ||
		operation == Operation::EORItoSR ||	operation == Operation::EORItoCCR ||
		operation == Operation::ORItoSR ||	operation == Operation::ORItoCCR
	);

	auto sr = status.status();
	switch(operation) {
		case Operation::ANDItoSR:	case Operation::ANDItoCCR:
			sr &= source;
		break;
		case Operation::EORItoSR:	case Operation::EORItoCCR:
			sr ^= source;
		break;
		case Operation::ORItoSR:	case Operation::ORItoCCR:
			sr |= source;
		break;
	}

	switch(operation) {
		case Operation::ANDItoSR:
		case Operation::EORItoSR:
		case Operation::ORItoSR:
			status.set_status(sr);
			flow_controller.did_update_status();
		break;

		case Operation::ANDItoCCR:
		case Operation::EORItoCCR:
		case Operation::ORItoCCR:
			status.set_ccr(sr);
		break;
	}
}